

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::checkteamkills(void)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  uint *puVar7;
  bool bVar8;
  
  uVar4 = gamemode + 3;
  if ((uVar4 < 0x1a) && ((0x3ffffe8UL >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
    puVar7 = (uint *)0x0;
    puVar3 = (uint *)(ulong)_DAT_00191e44;
    puVar5 = teamkillkicks;
    if ((int)_DAT_00191e44 < 1) {
      puVar3 = puVar7;
    }
    while (bVar8 = puVar3 != (uint *)0x0, puVar3 = (uint *)((long)puVar3 + -1), bVar8) {
      uVar1 = *puVar5;
      if (((uVar1 & 1 << ((byte)uVar4 & 0x1f)) != 0) &&
         ((puVar7 == (uint *)0x0 || ((uVar1 & ~*puVar7) == 0 && uVar1 != *puVar7)))) {
        puVar7 = puVar5;
      }
      puVar5 = puVar5 + 3;
    }
    uVar4 = DAT_00191e54;
    if (puVar7 != (uint *)0x0) {
      while (lVar2 = teamkills, 0 < (int)uVar4) {
        uVar4 = uVar4 - 1;
        uVar6 = (ulong)uVar4;
        if ((int)puVar7[1] <= *(int *)(teamkills + 4 + uVar6 * 8)) {
          if (0 < (int)puVar7[2]) {
            addban(*(uint *)(teamkills + uVar6 * 8),puVar7[2]);
          }
          kickclients(*(uint *)(lVar2 + uVar6 * 8),(clientinfo *)0x0);
          vector<server::teamkillinfo>::removeunordered
                    ((vector<server::teamkillinfo> *)&teamkills,uVar4);
        }
      }
    }
  }
  shouldcheckteamkills = 0;
  return;
}

Assistant:

void checkteamkills()
    {
        teamkillkick *kick = NULL;
        if(m_timed) loopv(teamkillkicks) if(teamkillkicks[i].match(gamemode) && (!kick || kick->includes(teamkillkicks[i])))
            kick = &teamkillkicks[i];
        if(kick) loopvrev(teamkills)
        {
            teamkillinfo &tk = teamkills[i];
            if(tk.teamkills >= kick->limit)
            {
                if(kick->ban > 0) addban(tk.ip, kick->ban);
                kickclients(tk.ip);
                teamkills.removeunordered(i);
            }
        }
        shouldcheckteamkills = false;
    }